

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_time.cpp
# Opt level: O2

void __thiscall Am_Time::operator-=(Am_Time *this,unsigned_long msec)

{
  Am_Time_Data *pAVar1;
  ulong uVar2;
  
  pAVar1 = this->data;
  for (uVar2 = msec * -1000 + (pAVar1->time).tv_usec; (long)uVar2 < 0; uVar2 = uVar2 + 1000000) {
    (pAVar1->time).tv_sec = (pAVar1->time).tv_sec + -1;
  }
  (pAVar1->time).tv_sec = (pAVar1->time).tv_sec + uVar2 / 1000000;
  (pAVar1->time).tv_usec = uVar2 % 1000000;
  return;
}

Assistant:

void
Am_Time::operator-=(unsigned long msec)
{
  long total_usec = data->time.tv_usec - msec * 1000;
  while (total_usec < 0) {
    total_usec += 1000000;
    data->time.tv_sec--;
  }
  data->time.tv_sec = data->time.tv_sec + total_usec / 1000000;
  data->time.tv_usec = total_usec % 1000000;
}